

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBridge.c
# Opt level: O0

DdNode * addBddDoStrictThreshold(DdManager *dd,DdNode *f,DdNode *val)

{
  DdHalfWord index;
  DdNode *T_00;
  DdNode *pDVar1;
  DdNode *local_68;
  DdNode *local_60;
  int v;
  DdNode *fvn;
  DdNode *fv;
  DdNode *E;
  DdNode *T;
  DdNode *res;
  DdNode *val_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  if (f->index == 0x7fffffff) {
    dd_local = (DdManager *)
               ((ulong)dd->one ^ (long)(int)(uint)((f->type).value <= (val->type).value));
  }
  else {
    dd_local = (DdManager *)cuddCacheLookup2(dd,addBddDoStrictThreshold,f,val);
    if (dd_local == (DdManager *)0x0) {
      index = f->index;
      pDVar1 = (f->type).kids.E;
      T_00 = addBddDoStrictThreshold(dd,(f->type).kids.T,val);
      if (T_00 == (DdNode *)0x0) {
        dd_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)T_00 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)T_00 & 0xfffffffffffffffe) + 4) + 1;
        pDVar1 = addBddDoStrictThreshold(dd,pDVar1,val);
        if (pDVar1 == (DdNode *)0x0) {
          Cudd_RecursiveDeref(dd,T_00);
          dd_local = (DdManager *)0x0;
        }
        else {
          *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
          if (((ulong)T_00 & 1) == 0) {
            local_68 = T_00;
            if (T_00 != pDVar1) {
              local_68 = cuddUniqueInter(dd,index,T_00,pDVar1);
            }
            T = local_68;
            if (local_68 == (DdNode *)0x0) {
              Cudd_RecursiveDeref(dd,T_00);
              Cudd_RecursiveDeref(dd,pDVar1);
              return (DdNode *)0x0;
            }
          }
          else {
            if (T_00 == pDVar1) {
              local_60 = (DdNode *)((ulong)T_00 ^ 1);
            }
            else {
              local_60 = cuddUniqueInter(dd,index,(DdNode *)((ulong)T_00 ^ 1),
                                         (DdNode *)((ulong)pDVar1 ^ 1));
            }
            if (local_60 == (DdNode *)0x0) {
              Cudd_RecursiveDeref(dd,T_00);
              Cudd_RecursiveDeref(dd,pDVar1);
              return (DdNode *)0x0;
            }
            T = (DdNode *)((ulong)local_60 ^ 1);
          }
          *(int *)(((ulong)T_00 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)T_00 & 0xfffffffffffffffe) + 4) + -1;
          *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + -1;
          cuddCacheInsert2(dd,addBddDoStrictThreshold,f,val,T);
          dd_local = (DdManager *)T;
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

static DdNode *
addBddDoStrictThreshold(
  DdManager * dd,
  DdNode * f,
  DdNode * val)
{
    DdNode *res, *T, *E;
    DdNode *fv, *fvn;
    int v;

    statLine(dd);
    /* Check terminal case. */
    if (cuddIsConstant(f)) {
        return(Cudd_NotCond(DD_ONE(dd),cuddV(f) <= cuddV(val)));
    }

    /* Check cache. */
    res = cuddCacheLookup2(dd,addBddDoStrictThreshold,f,val);
    if (res != NULL) return(res);

    /* Recursive step. */
    v = f->index;
    fv = cuddT(f); fvn = cuddE(f);

    T = addBddDoStrictThreshold(dd,fv,val);
    if (T == NULL) return(NULL);
    cuddRef(T);

    E = addBddDoStrictThreshold(dd,fvn,val);
    if (E == NULL) {
        Cudd_RecursiveDeref(dd, T);
        return(NULL);
    }
    cuddRef(E);
    if (Cudd_IsComplement(T)) {
        res = (T == E) ? Cudd_Not(T) : cuddUniqueInter(dd,v,Cudd_Not(T),Cudd_Not(E));
        if (res == NULL) {
            Cudd_RecursiveDeref(dd, T);
            Cudd_RecursiveDeref(dd, E);
            return(NULL);
        }
        res = Cudd_Not(res);
    } else {
        res = (T == E) ? T : cuddUniqueInter(dd,v,T,E);
        if (res == NULL) {
            Cudd_RecursiveDeref(dd, T);
            Cudd_RecursiveDeref(dd, E);
            return(NULL);
        }
    }
    cuddDeref(T);
    cuddDeref(E);

    /* Store result. */
    cuddCacheInsert2(dd,addBddDoStrictThreshold,f,val,res);

    return(res);

}